

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O3

void CECoordinates::CIRS2ICRS
               (double input_ra,double input_dec,double *return_ra,double *return_dec,CEDate *date,
               CEAngleType *angle_type)

{
  double eo;
  double tdb2;
  double tdb1;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  local_50 = input_ra;
  local_48 = input_dec;
  if (*angle_type == DEGREES) {
    local_50 = input_ra * 0.017453292519943295;
    local_48 = input_dec * 0.017453292519943295;
  }
  local_30 = 0.0;
  local_38 = 0.0;
  (*date->_vptr_CEDate[5])(date);
  CEDate::UTC2TDB(&local_40,&local_30,&local_38);
  iauAtic13(local_50,local_48,local_30,local_38,return_ra,return_dec,&local_40);
  if (*angle_type == DEGREES) {
    *return_ra = *return_ra * 57.29577951308232;
    *return_dec = *return_dec * 57.29577951308232;
  }
  return;
}

Assistant:

void CECoordinates::CIRS2ICRS(double input_ra, double input_dec,
                              double *return_ra, double *return_dec,
                              const CEDate& date, const CEAngleType& angle_type)
{
    // Convert to radians if that's what is passed
    if (angle_type==CEAngleType::DEGREES) {
        input_ra  *= DD2R ;
        input_dec *= DD2R ;
    }
    
    // Use the sofa library to convert these coordinates
    double eo ; // Equation of the origins
    double tdb1(0.0);
    double tdb2(0.0);
    CEDate::UTC2TDB(date.MJD(), &tdb1, &tdb2);
    iauAtic13(input_ra, input_dec, tdb1, tdb2, return_ra, return_dec, &eo) ;

    // Subtract the eo from RA if J2000 coordinates are desired
    //*return_ra -= eo ;
    
    // Return the coordinates in the requested units
    if (angle_type == CEAngleType::DEGREES) {
        *return_ra  *= DR2D ;
        *return_dec *= DR2D ;
    }
}